

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O3

int nn_surveyor_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint8_t *buf;
  
  if ((*(uint *)&self[0x20].sock < 7) && ((0x46U >> (*(uint *)&self[0x20].sock & 0x1f) & 1) != 0)) {
    iVar1 = -0x9523dfe;
    if (*(int *)((long)&self[0x35].sock + 4) == 1) {
      *(undefined4 *)((long)&self[0x35].sock + 4) = 0;
      iVar1 = -0x6e;
    }
  }
  else {
    do {
      do {
        iVar1 = nn_xsurveyor_recv(self,msg);
        if (iVar1 != 0) {
          if (iVar1 == -0xb) {
            return -0xb;
          }
          nn_surveyor_recv_cold_1();
        }
        sVar3 = nn_chunkref_size(&msg->sphdr);
      } while (sVar3 != 4);
      buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
      uVar2 = nn_getl(buf);
    } while (uVar2 != *(uint32_t *)((long)&self[0x20].sock + 4));
    nn_chunkref_term(&msg->sphdr);
    iVar1 = 0;
    nn_chunkref_init(&msg->sphdr,0);
  }
  return iVar1;
}

Assistant:

static int nn_surveyor_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_surveyor *surveyor;
    uint32_t surveyid;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  If no survey is going on return EFSM error. */
    if (nn_slow (!nn_surveyor_inprogress (surveyor))) {
        if (surveyor->timedout == NN_SURVEYOR_TIMEDOUT) {
            surveyor->timedout = 0;
            return -ETIMEDOUT;
        } else
            return -EFSM;
    }

    while (1) {

        /*  Get next response. */
        rc = nn_xsurveyor_recv (&surveyor->xsurveyor.sockbase, msg);
        if (nn_slow (rc == -EAGAIN))
            return -EAGAIN;
        errnum_assert (rc == 0, -rc);

        /*  Get the survey ID. Ignore any stale responses. */
        /*  TODO: This should be done asynchronously! */
        if (nn_slow (nn_chunkref_size (&msg->sphdr) != sizeof (uint32_t)))
            continue;
        surveyid = nn_getl (nn_chunkref_data (&msg->sphdr));
        if (nn_slow (surveyid != surveyor->surveyid))
            continue;

        /*  Discard the header and return the message to the user. */
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, 0);
        break;
    }

    return 0;
}